

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O0

istream * operator>>(istream *s,Circuit *C)

{
  int iVar1;
  istream *piVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  runtime_error *prVar8;
  uint *in_RSI;
  istream *in_RDI;
  uint j_1;
  uint j;
  uint i_2;
  string ss;
  uint out;
  uint in;
  uint i_1;
  uint i;
  uint te;
  uint nG;
  size_type in_stack_ffffffffffffff38;
  Circuit *in_stack_ffffffffffffff40;
  uint local_6c;
  uint local_68;
  uint local_64 [6];
  uint local_4c;
  string local_48 [32];
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint *local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  piVar2 = (istream *)std::istream::operator>>(in_RDI,&local_14);
  std::istream::operator>>(piVar2,local_10);
  std::vector<GateType,_std::allocator<GateType>_>::resize
            ((vector<GateType,_std::allocator<GateType>_> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::istream::operator>>(local_8,&local_18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  for (local_1c = 0; uVar3 = (ulong)local_1c,
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_10 + 2)),
      piVar2 = local_8, uVar3 < sVar4; local_1c = local_1c + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_10 + 2),
                        (ulong)local_1c);
    std::istream::operator>>(piVar2,pvVar5);
  }
  std::istream::operator>>(local_8,&local_18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  for (local_20 = 0; uVar3 = (ulong)local_20,
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_10 + 8)),
      piVar2 = local_8, uVar3 < sVar4; local_20 = local_20 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_10 + 8),
                        (ulong)local_20);
    std::istream::operator>>(piVar2,pvVar5);
  }
  std::__cxx11::string::string(local_48);
  local_4c = 0;
  while( true ) {
    if (local_14 <= local_4c) {
      Circuit::recompute_map(in_stack_ffffffffffffff40);
      std::__cxx11::string::~string(local_48);
      return (istream *)local_8;
    }
    piVar2 = (istream *)std::istream::operator>>(local_8,&local_24);
    std::istream::operator>>(piVar2,&local_28);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)(local_10 + 0x14),(ulong)local_4c);
    local_64[1] = 2;
    local_64[0] = local_24;
    std::max<int>((int *)(local_64 + 1),(int *)local_64);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)(local_10 + 0x1a),(ulong)local_4c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    for (local_68 = 0; piVar2 = local_8, local_68 < local_24; local_68 = local_68 + 1) {
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)(local_10 + 0x14),(ulong)local_4c);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar6,(ulong)local_68);
      std::istream::operator>>(piVar2,pvVar5);
    }
    for (local_6c = 0; piVar2 = local_8, local_6c < local_28; local_6c = local_6c + 1) {
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)(local_10 + 0x1a),(ulong)local_4c);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar6,(ulong)local_6c);
      std::istream::operator>>(piVar2,pvVar5);
    }
    std::operator>>((istream *)local_8,local_48);
    iVar1 = std::__cxx11::string::compare((char *)local_48);
    if (iVar1 == 0) {
      pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                         ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                          (ulong)local_4c);
      *pvVar7 = AND;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)local_48);
      if (iVar1 == 0) {
        pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                           ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                            (ulong)local_4c);
        *pvVar7 = XOR;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)local_48);
        if (iVar1 == 0) {
          pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                             ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                              (ulong)local_4c);
          *pvVar7 = INV;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)local_48);
          if (iVar1 == 0) {
            pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                               ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                                (ulong)local_4c);
            *pvVar7 = EQ;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)local_48);
            if (iVar1 == 0) {
              pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                                 ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                                  (ulong)local_4c);
              *pvVar7 = EQW;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)local_48);
              if (iVar1 != 0) {
                prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar8,"Circuit error");
                __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                                 ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                                  (ulong)local_4c);
              *pvVar7 = MAND;
            }
          }
        }
      }
    }
    pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                       ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                        (ulong)local_4c);
    if ((((*pvVar7 == INV) ||
         (pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                             ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                              (ulong)local_4c), *pvVar7 == EQ)) ||
        (pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                            ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                             (ulong)local_4c), *pvVar7 == EQW)) && (local_24 != 1)) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"Circuit error");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                       ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                        (ulong)local_4c);
    if (((*pvVar7 == AND) ||
        (pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                            ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                             (ulong)local_4c), *pvVar7 == XOR)) && (local_24 != 2)) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"Circuit error");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                       ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                        (ulong)local_4c);
    if ((*pvVar7 != MAND) && (local_28 != 1)) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"Circuit error");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar7 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                       ((vector<GateType,_std::allocator<GateType>_> *)(local_10 + 0xe),
                        (ulong)local_4c);
    if ((*pvVar7 == MAND) && (local_28 != local_24 >> 1)) break;
    local_4c = local_4c + 1;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,"Circuit error");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

istream &operator>>(istream &s, Circuit &C) {
  unsigned int nG, te;
  s >> nG >> C.nWires;

  C.GateT.resize(nG);
  C.GateI.resize(nG);
  C.GateO.resize(nG);

  s >> te;
  C.numI.resize(te);
  for (unsigned int i = 0; i < C.numI.size(); i++) {
    s >> C.numI[i];
  }

  s >> te;
  C.numO.resize(te);
  for (unsigned int i = 0; i < C.numO.size(); i++) {
    s >> C.numO[i];
  }

  unsigned int in, out;
  string ss;
  for (unsigned int i = 0; i < nG; i++) {
    s >> in >> out;
    C.GateI[i].resize(max(2, (int)in));
    C.GateO[i].resize(out);
    for (unsigned int j = 0; j < in; j++) {
      s >> C.GateI[i][j];
    }
    for (unsigned int j = 0; j < out; j++) {
      s >> C.GateO[i][j];
    }
    s >> ss;
    if (ss.compare("AND") == 0) {
      C.GateT[i] = AND;
    } else if (ss.compare("XOR") == 0) {
      C.GateT[i] = XOR;
    } else if (ss.compare("INV") == 0) {
      C.GateT[i] = INV;
    } else if (ss.compare("EQ") == 0) {
      C.GateT[i] = EQ;
    } else if (ss.compare("EQW") == 0) {
      C.GateT[i] = EQW;
    } else if (ss.compare("MAND") == 0) {
      C.GateT[i] = MAND;
    } else {
      throw std::runtime_error("Circuit error");
    }

    // Check dimensions of in and out are all OK
    if ((C.GateT[i] == INV || C.GateT[i] == EQ || C.GateT[i] == EQW) &&
        in != 1) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] == AND || C.GateT[i] == XOR) && in != 2) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] != MAND) && out != 1) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] == MAND) && out != in / 2) {
      throw std::runtime_error("Circuit error");
    }
  }

  C.recompute_map();

  return s;
}